

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O1

void __thiscall chaiscript::detail::Any::Any(Any *this,Any *t_any)

{
  _Head_base<0UL,_chaiscript::detail::Any::Data_*,_false> _Var1;
  _Head_base<0UL,_chaiscript::detail::Any::Data_*,_false> _Var2;
  Data *in_RAX;
  pointer *__ptr_1;
  pointer *__ptr;
  _Head_base<0UL,_chaiscript::detail::Any::Data_*,_false> local_18;
  
  (this->m_data)._M_t.
  super___uniq_ptr_impl<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>_>
  ._M_t.
  super__Tuple_impl<0UL,_chaiscript::detail::Any::Data_*,_std::default_delete<chaiscript::detail::Any::Data>_>
  .super__Head_base<0UL,_chaiscript::detail::Any::Data_*,_false>._M_head_impl = (Data *)0x0;
  _Var1._M_head_impl =
       (t_any->m_data)._M_t.
       super___uniq_ptr_impl<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>_>
       ._M_t.
       super__Tuple_impl<0UL,_chaiscript::detail::Any::Data_*,_std::default_delete<chaiscript::detail::Any::Data>_>
       .super__Head_base<0UL,_chaiscript::detail::Any::Data_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (Data *)0x0) {
    (this->m_data)._M_t.
    super___uniq_ptr_impl<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>_>
    ._M_t.
    super__Tuple_impl<0UL,_chaiscript::detail::Any::Data_*,_std::default_delete<chaiscript::detail::Any::Data>_>
    .super__Head_base<0UL,_chaiscript::detail::Any::Data_*,_false>._M_head_impl = (Data *)0x0;
  }
  else {
    local_18._M_head_impl = in_RAX;
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_Data + 0x18))(&local_18);
    _Var2._M_head_impl = local_18._M_head_impl;
    local_18._M_head_impl = (Data *)0x0;
    _Var1._M_head_impl =
         (this->m_data)._M_t.
         super___uniq_ptr_impl<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>_>
         ._M_t.
         super__Tuple_impl<0UL,_chaiscript::detail::Any::Data_*,_std::default_delete<chaiscript::detail::Any::Data>_>
         .super__Head_base<0UL,_chaiscript::detail::Any::Data_*,_false>._M_head_impl;
    (this->m_data)._M_t.
    super___uniq_ptr_impl<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>_>
    ._M_t.
    super__Tuple_impl<0UL,_chaiscript::detail::Any::Data_*,_std::default_delete<chaiscript::detail::Any::Data>_>
    .super__Head_base<0UL,_chaiscript::detail::Any::Data_*,_false>._M_head_impl = _Var2._M_head_impl
    ;
    if (_Var1._M_head_impl != (Data *)0x0) {
      (**(code **)((long)(_Var1._M_head_impl)->_vptr_Data + 8))();
    }
    if (local_18._M_head_impl != (Data *)0x0) {
      (*(local_18._M_head_impl)->_vptr_Data[1])();
    }
  }
  return;
}

Assistant:

Any(const Any &t_any) 
        { 
          if (!t_any.empty())
          {
            m_data = t_any.m_data->clone(); 
          } else {
            m_data.reset();
          }
        }